

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Transmitter_PDU.cpp
# Opt level: O0

KBOOL __thiscall
KDIS::PDU::Transmitter_PDU::operator==(Transmitter_PDU *this,Transmitter_PDU *Value)

{
  KBOOL KVar1;
  Transmitter_PDU *Value_local;
  Transmitter_PDU *this_local;
  
  KVar1 = Radio_Communications_Header::operator!=
                    (&this->super_Radio_Communications_Header,
                     &Value->super_Radio_Communications_Header);
  if (KVar1) {
    this_local._7_1_ = false;
  }
  else {
    KVar1 = DATA_TYPE::RadioEntityType::operator!=
                      (&this->m_RadioEntityType,&Value->m_RadioEntityType);
    if (KVar1) {
      this_local._7_1_ = false;
    }
    else if (this->m_ui8TransmitterState == Value->m_ui8TransmitterState) {
      if (this->m_ui8InputSource == Value->m_ui8InputSource) {
        KVar1 = DATA_TYPE::AntennaLocation::operator!=
                          (&this->m_AntennaLocation,&Value->m_AntennaLocation);
        if (KVar1) {
          this_local._7_1_ = false;
        }
        else if (this->m_ui16AntennaPatternType == Value->m_ui16AntennaPatternType) {
          if (this->m_ui16AntennaPatternLength == Value->m_ui16AntennaPatternLength) {
            if (this->m_ui64Freq == Value->m_ui64Freq) {
              if (((float)this->m_f32TransmitFreqBW != (float)Value->m_f32TransmitFreqBW) ||
                 (NAN((float)this->m_f32TransmitFreqBW) || NAN((float)Value->m_f32TransmitFreqBW)))
              {
                this_local._7_1_ = false;
              }
              else if (((float)this->m_f32Power != (float)Value->m_f32Power) ||
                      (NAN((float)this->m_f32Power) || NAN((float)Value->m_f32Power))) {
                this_local._7_1_ = false;
              }
              else {
                KVar1 = DATA_TYPE::ModulationType::operator!=
                                  (&this->m_ModulationType,&Value->m_ModulationType);
                if (KVar1) {
                  this_local._7_1_ = false;
                }
                else {
                  KVar1 = DATA_TYPE::CryptoSystem::operator!=
                                    (&this->m_CryptoSystem,&Value->m_CryptoSystem);
                  if (KVar1) {
                    this_local._7_1_ = false;
                  }
                  else if (this->m_ui8LengthOfModulationParam == Value->m_ui8LengthOfModulationParam
                          ) {
                    this_local._7_1_ = true;
                  }
                  else {
                    this_local._7_1_ = false;
                  }
                }
              }
            }
            else {
              this_local._7_1_ = false;
            }
          }
          else {
            this_local._7_1_ = false;
          }
        }
        else {
          this_local._7_1_ = false;
        }
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

KBOOL Transmitter_PDU::operator == ( const Transmitter_PDU & Value ) const
{
    if( Radio_Communications_Header::operator !=( Value ) )                           return false;
    if( m_RadioEntityType                     != Value.m_RadioEntityType )            return false;
    if( m_ui8TransmitterState                 != Value.m_ui8TransmitterState )        return false;
    if( m_ui8InputSource                      != Value.m_ui8InputSource )             return false;
    if( m_AntennaLocation                     != Value.m_AntennaLocation )            return false;
    if( m_ui16AntennaPatternType              != Value.m_ui16AntennaPatternType )     return false;
    if( m_ui16AntennaPatternLength            != Value.m_ui16AntennaPatternLength )   return false;
    if( m_ui64Freq                            != Value.m_ui64Freq )                   return false;
    if( m_f32TransmitFreqBW                   != Value.m_f32TransmitFreqBW )          return false;
    if( m_f32Power                            != Value.m_f32Power )                   return false;
    if( m_ModulationType                      != Value.m_ModulationType )             return false;
    if( m_CryptoSystem                        != Value.m_CryptoSystem )               return false;
    if( m_ui8LengthOfModulationParam          != Value.m_ui8LengthOfModulationParam ) return false;
    return true;
}